

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

bool __thiscall gmlc::networking::TcpServer::start(TcpServer *this)

{
  bool bVar1;
  bool bVar2;
  element_type *peVar3;
  allocator<char> *in_RDI;
  shared_ptr<gmlc::networking::TcpAcceptor> *acc;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  *__range2;
  bool success;
  shared_ptr<gmlc::networking::TcpConnection> *conn;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  *__range3;
  lock_guard<std::mutex> lock;
  TcpServer *in_stack_000001b0;
  mutex_type *in_stack_fffffffffffffe98;
  memory_order in_stack_fffffffffffffea0;
  memory_order in_stack_fffffffffffffea4;
  atomic<bool> *in_stack_fffffffffffffea8;
  int iVar4;
  TcpServer *in_stack_fffffffffffffeb0;
  TcpServer *this_00;
  undefined6 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  io_context *in_stack_fffffffffffffec0;
  SocketFactory *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined1 local_100 [32];
  __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
  in_stack_ffffffffffffff20;
  undefined8 local_b8;
  undefined8 local_b0;
  allocator<char> local_99 [37];
  int local_74;
  duration<long,std::ratio<1l,1000l>> local_70 [12];
  int local_64;
  duration<long,std::ratio<1l,1000l>> local_60 [31];
  allocator<char> local_41;
  pointer *in_stack_ffffffffffffffc0;
  TcpAcceptor *in_stack_ffffffffffffffc8;
  int local_1c;
  TcpServer *in_stack_ffffffffffffffe8;
  milliseconds timeOut;
  
  timeOut.__r = (rep)in_RDI;
  bVar1 = std::atomic<bool>::load(in_stack_fffffffffffffea8,in_stack_fffffffffffffea4);
  if (bVar1) {
    local_1c = 1000;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffffe8,&local_1c);
    bVar1 = reConnect(in_stack_ffffffffffffffe8,timeOut);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffec8 = (SocketFactory *)&local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_RDI);
      logger(in_stack_fffffffffffffeb0,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
             (string *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      std::allocator<char>::~allocator(&local_41);
      std::
      vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
      ::clear((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
               *)0x729c9e);
      local_64 = 200;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_60,&local_64);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffee0);
      std::atomic<bool>::store
                (in_stack_fffffffffffffea8,SUB41(in_stack_fffffffffffffea4 >> 0x18,0),
                 in_stack_fffffffffffffea0);
      initialConnect(in_stack_000001b0);
      bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffffea8);
      iVar4 = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      if (bVar1) {
        local_74 = 1000;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_70,&local_74);
        bVar1 = reConnect(in_stack_ffffffffffffffe8,timeOut);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_RDI);
          logger(in_stack_fffffffffffffeb0,iVar4,
                 (string *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
          std::allocator<char>::~allocator(local_99);
          return false;
        }
      }
    }
  }
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
             ,in_stack_fffffffffffffe98);
  bVar1 = std::
          vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
          ::empty((vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
                   *)in_stack_fffffffffffffeb0);
  if (!bVar1) {
    local_b0 = in_RDI + 0xf8;
    local_b8 = std::
               vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
               ::begin((vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
                        *)in_stack_fffffffffffffe98);
    std::
    vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
    ::end((vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
           *)in_stack_fffffffffffffe98);
    while (bVar1 = __gnu_cxx::
                   operator==<std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                             ((__normal_iterator<std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                              (__normal_iterator<std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                               *)in_stack_fffffffffffffe98), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
      ::operator*((__normal_iterator<std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                   *)&stack0xffffffffffffff48);
      std::
      __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x729ef4);
      in_stack_fffffffffffffebf = TcpConnection::isReceiving((TcpConnection *)0x729efc);
      if (!(bool)in_stack_fffffffffffffebf) {
        std::
        __shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x729f19);
        TcpConnection::startReceive((TcpConnection *)in_stack_ffffffffffffff20._M_current);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
      ::operator++((__normal_iterator<std::shared_ptr<gmlc::networking::TcpConnection>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>_>
                    *)&stack0xffffffffffffff48);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x729f6e);
  bVar1 = true;
  std::
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ::begin((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
           *)in_stack_fffffffffffffe98);
  local_100._24_8_ =
       std::
       vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
       ::end((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
              *)in_stack_fffffffffffffe98);
  while (bVar2 = __gnu_cxx::
                 operator==<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                           ((__normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                            (__normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                             *)in_stack_fffffffffffffe98), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_100._16_8_ =
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
         ::operator*((__normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                      *)&stack0xffffffffffffff20);
    peVar3 = std::
             __shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x729fed);
    iVar4 = (int)((ulong)peVar3 >> 0x20);
    this_00 = (TcpServer *)local_100;
    TcpConnection::create
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
               CONCAT17(in_stack_fffffffffffffebf,
                        CONCAT16(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8)));
    in_stack_fffffffffffffebe =
         TcpAcceptor::start(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    in_stack_fffffffffffffea4 =
         CONCAT13(in_stack_fffffffffffffebe,(int3)in_stack_fffffffffffffea4) ^ 0xff000000;
    std::shared_ptr<gmlc::networking::TcpConnection>::~shared_ptr
              ((shared_ptr<gmlc::networking::TcpConnection> *)0x72a044);
    if ((in_stack_fffffffffffffea4 & 0x1000000) != relaxed) {
      in_stack_fffffffffffffe98 = (mutex_type *)&stack0xfffffffffffffedf;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_RDI);
      logger(this_00,iVar4,(string *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
      bVar1 = false;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<gmlc::networking::TcpAcceptor>_*,_std::vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>_>
                  *)&stack0xffffffffffffff20);
  }
  return bVar1;
}

Assistant:

bool TcpServer::start()
{
    if (halted.load(std::memory_order_acquire)) {
        if (!reConnect(std::chrono::milliseconds(1000))) {
            logger(0, "reconnect failed");
            acceptors.clear();
            std::this_thread::sleep_for(std::chrono::milliseconds(200));
            halted.store(false);
            initialConnect();
            if (halted) {
                if (!reConnect(std::chrono::milliseconds(1000))) {
                    logger(0, "reconnect part 2 failed");
                    return false;
                }
            }
        }
    }

    {  // scope for the lock_guard
        std::lock_guard<std::mutex> lock(accepting);
        if (!connections.empty()) {
            for (auto& conn : connections) {
                if (!conn->isReceiving()) {
                    conn->startReceive();
                }
            }
        }
    }
    bool success = true;
    for (auto& acc : acceptors) {
        if (!acc->start(
                TcpConnection::create(socket_factory, ioctx, bufferSize))) {
            logger(0, "acceptor has failed to start");
            success = false;
        }
    }
    return success;
}